

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptSamplerState(HlslGrammar *this)

{
  bool bVar1;
  TIntermTyped *local_f8;
  TIntermTyped *lodBias;
  HlslToken addrMode;
  HlslToken filterMode;
  TIntermTyped *maxAnisotropy;
  TIntermTyped *lod;
  char *local_88;
  char *local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  local_70;
  undefined1 local_68 [8];
  TString stateName;
  HlslToken state;
  HlslGrammar *this_local;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (bVar1) {
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this->parseContext,&(this->super_HlslTokenStream).token,"unimplemented",
               "immediate sampler state","");
    do {
      HlslToken::HlslToken((HlslToken *)((long)&stateName.field_2 + 8));
      bVar1 = acceptIdentifier(this,(HlslToken *)((long)&stateName.field_2 + 8));
      if (!bVar1) {
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
        if (bVar1) {
          this_local._7_1_ = 1;
        }
        else {
          this_local._7_1_ = 0;
        }
        break;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   local_68,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)state._24_8_);
      local_70._M_current =
           (char *)std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::begin
                             ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)local_68);
      local_78._M_current =
           (char *)std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::end
                             ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)local_68);
      local_80 = (char *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         ::begin((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)local_68);
      local_88 = (char *)std::
                         transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,int(*)(int)noexcept>
                                   (local_70,local_78,
                                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                                     )local_80,tolower);
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
      if (bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)local_68,"minlod");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)local_68,"maxlod"), bVar1)) {
          bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
          if (bVar1) {
            maxAnisotropy = (TIntermTyped *)0x0;
            bVar1 = acceptLiteral(this,&maxAnisotropy);
            if (bVar1) goto LAB_0067196c;
            this_local._7_1_ = 0;
            lod._4_4_ = 1;
          }
          else {
            expected(this,"integer");
            this_local._7_1_ = 0;
            lod._4_4_ = 1;
          }
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)local_68,"maxanisotropy");
          if (bVar1) {
            bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
            if (bVar1) {
              filterMode.field_2.string = (TString *)0x0;
              bVar1 = acceptLiteral(this,(TIntermTyped **)&filterMode.field_2.string);
              if (bVar1) goto LAB_0067196c;
              this_local._7_1_ = 0;
              lod._4_4_ = 1;
            }
            else {
              expected(this,"integer");
              this_local._7_1_ = 0;
              lod._4_4_ = 1;
            }
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)local_68,"filter");
            if (bVar1) {
              HlslToken::HlslToken((HlslToken *)&addrMode.field_2);
              bVar1 = acceptIdentifier(this,(HlslToken *)&addrMode.field_2);
              if (bVar1) {
LAB_0067196c:
                bVar1 = HlslTokenStream::acceptTokenClass
                                  (&this->super_HlslTokenStream,EHTokSemicolon);
                if (bVar1) {
                  lod._4_4_ = 0;
                }
                else {
                  expected(this,"semicolon");
                  this_local._7_1_ = 0;
                  lod._4_4_ = 1;
                }
              }
              else {
                expected(this,"filter mode");
                this_local._7_1_ = 0;
                lod._4_4_ = 1;
              }
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)local_68,"addressu");
              if (((bVar1) ||
                  (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            *)local_68,"addressv"), bVar1)) ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                           *)local_68,"addressw"), bVar1)) {
                HlslToken::HlslToken((HlslToken *)&lodBias);
                bVar1 = acceptIdentifier(this,(HlslToken *)&lodBias);
                if (bVar1) goto LAB_0067196c;
                expected(this,"texture address mode");
                this_local._7_1_ = 0;
                lod._4_4_ = 1;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                         *)local_68,"miplodbias");
                if (bVar1) {
                  local_f8 = (TIntermTyped *)0x0;
                  bVar1 = acceptLiteral(this,&local_f8);
                  if (bVar1) goto LAB_0067196c;
                  expected(this,"lod bias");
                  this_local._7_1_ = 0;
                  lod._4_4_ = 1;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                           *)local_68,"bordercolor");
                  if (bVar1) {
                    this_local._7_1_ = 0;
                    lod._4_4_ = 1;
                  }
                  else {
                    expected(this,"texture state");
                    this_local._7_1_ = 0;
                    lod._4_4_ = 1;
                  }
                }
              }
            }
          }
        }
      }
      else {
        expected(this,"assign");
        this_local._7_1_ = 0;
        lod._4_4_ = 1;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    local_68);
    } while (lod._4_4_ == 0);
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HlslGrammar::acceptSamplerState()
{
    // TODO: this should be genericized to accept a list of valid tokens and
    // return token/value pairs.  Presently it is specific to texture values.

    if (! acceptTokenClass(EHTokLeftBrace))
        return true;

    parseContext.warn(token.loc, "unimplemented", "immediate sampler state", "");

    do {
        // read state name
        HlslToken state;
        if (! acceptIdentifier(state))
            break;  // end of list

        // FXC accepts any case
        TString stateName = *state.string;
        std::transform(stateName.begin(), stateName.end(), stateName.begin(), ::tolower);

        if (! acceptTokenClass(EHTokAssign)) {
            expected("assign");
            return false;
        }

        if (stateName == "minlod" || stateName == "maxlod") {
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("integer");
                return false;
            }

            TIntermTyped* lod = nullptr;
            if (! acceptLiteral(lod))  // should never fail, since we just looked for an integer
                return false;
        } else if (stateName == "maxanisotropy") {
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("integer");
                return false;
            }

            TIntermTyped* maxAnisotropy = nullptr;
            if (! acceptLiteral(maxAnisotropy))  // should never fail, since we just looked for an integer
                return false;
        } else if (stateName == "filter") {
            HlslToken filterMode;
            if (! acceptIdentifier(filterMode)) {
                expected("filter mode");
                return false;
            }
        } else if (stateName == "addressu" || stateName == "addressv" || stateName == "addressw") {
            HlslToken addrMode;
            if (! acceptIdentifier(addrMode)) {
                expected("texture address mode");
                return false;
            }
        } else if (stateName == "miplodbias") {
            TIntermTyped* lodBias = nullptr;
            if (! acceptLiteral(lodBias)) {
                expected("lod bias");
                return false;
            }
        } else if (stateName == "bordercolor") {
            return false;
        } else {
            expected("texture state");
            return false;
        }

        // SEMICOLON
        if (! acceptTokenClass(EHTokSemicolon)) {
            expected("semicolon");
            return false;
        }
    } while (true);

    if (! acceptTokenClass(EHTokRightBrace))
        return false;

    return true;
}